

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_lzw.c
# Opt level: O1

int LZWDecodeCompat(TIFF *tif,uint8_t *op0,tmsize_t occ0,uint16_t s)

{
  byte *pbVar1;
  uint8_t *puVar2;
  long *plVar3;
  uint8_t *puVar4;
  uint uVar5;
  long lVar6;
  long *plVar7;
  long *plVar8;
  long lVar9;
  long lVar10;
  uint8_t *puVar11;
  char *fmt;
  tmsize_t tVar12;
  char *module;
  ulong uVar13;
  long *plVar14;
  int iVar15;
  byte *pbVar16;
  ulong uVar17;
  long *plVar18;
  ulong uVar19;
  ulong local_70;
  ulong local_68;
  long local_58;
  
  puVar2 = tif->tif_data;
  if (puVar2 == (uint8_t *)0x0) {
    __assert_fail("sp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_lzw.c"
                  ,0x32f,"int LZWDecodeCompat(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  lVar10 = *(long *)(puVar2 + 0xa8);
  lVar9 = occ0;
  if (lVar10 != 0) {
    plVar18 = *(long **)(puVar2 + 200);
    lVar6 = (ulong)*(ushort *)(plVar18 + 1) - lVar10;
    lVar9 = occ0 - lVar6;
    if (occ0 < lVar6) {
      *(long *)(puVar2 + 0xa8) = lVar10 + occ0;
      lVar10 = lVar6;
      do {
        plVar18 = (long *)*plVar18;
        lVar10 = lVar10 + -1;
      } while (occ0 < lVar10);
      lVar9 = 0;
      tVar12 = occ0;
      do {
        op0[tVar12 + -1] = *(uint8_t *)((long)plVar18 + 0xb);
        plVar18 = (long *)*plVar18;
        tVar12 = tVar12 + -1;
      } while (tVar12 != 0);
    }
    else {
      lVar10 = lVar6;
      do {
        op0[lVar10 + -1] = *(uint8_t *)((long)plVar18 + 0xb);
        plVar18 = (long *)*plVar18;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
      puVar2[0xa8] = '\0';
      puVar2[0xa9] = '\0';
      puVar2[0xaa] = '\0';
      puVar2[0xab] = '\0';
      puVar2[0xac] = '\0';
      puVar2[0xad] = '\0';
      puVar2[0xae] = '\0';
      puVar2[0xaf] = '\0';
      op0 = op0 + lVar6;
    }
    if (occ0 < lVar6) {
      return 1;
    }
  }
  pbVar16 = tif->tif_rawcp;
  local_70 = (tif->tif_rawcc - *(long *)(puVar2 + 0xb8)) * 8 + *(long *)(puVar2 + 0xb0);
  *(ulong *)(puVar2 + 0xb0) = local_70;
  uVar17 = (ulong)*(ushort *)(puVar2 + 0x80);
  local_68 = *(ulong *)(puVar2 + 0x88);
  local_58 = *(long *)(puVar2 + 0x90);
  uVar19 = *(ulong *)(puVar2 + 0xa0);
  plVar18 = *(long **)(puVar2 + 0xd8);
  plVar14 = *(long **)(puVar2 + 0xe0);
  plVar8 = *(long **)(puVar2 + 0xd0);
joined_r0x002aed0a:
  do {
    puVar4 = op0;
    if (lVar9 < 1) goto LAB_002af06c;
    if (local_70 < uVar17) {
      TIFFWarningExtR(tif,"LZWDecodeCompat","LZWDecode: Strip %u not terminated with EOI code",
                      (ulong)tif->tif_curstrip);
      uVar5 = 0x101;
    }
    else {
      uVar13 = (ulong)*pbVar16 << ((byte)local_58 & 0x3f) | local_68;
      lVar10 = local_58 + 8;
      if (lVar10 < (long)uVar17) {
        pbVar1 = pbVar16 + 1;
        pbVar16 = pbVar16 + 2;
        uVar13 = uVar13 | (ulong)*pbVar1 << ((byte)lVar10 & 0x3f);
        lVar10 = local_58 + 0x10;
      }
      else {
        pbVar16 = pbVar16 + 1;
      }
      local_68 = uVar13 >> ((byte)uVar17 & 0x3f);
      uVar5 = (uint)uVar13 & (uint)uVar19 & 0xffff;
      local_58 = lVar10 - uVar17;
      local_70 = local_70 - uVar17;
    }
    if (uVar5 == 0x100) {
      do {
        plVar18 = (long *)(*(long *)(puVar2 + 0xe8) + 0x1020);
        _TIFFmemset(plVar18,0,0x12fd0);
        lVar10 = *(long *)(puVar2 + 0xe8);
        if (local_70 < 9) {
          TIFFWarningExtR(tif,"LZWDecodeCompat","LZWDecode: Strip %u not terminated with EOI code",
                          (ulong)tif->tif_curstrip);
          uVar5 = 0x101;
        }
        else {
          local_68 = (ulong)*pbVar16 << ((byte)local_58 & 0x3f) | local_68;
          lVar6 = local_58 + 8;
          if (local_58 < 1) {
            pbVar1 = pbVar16 + 1;
            pbVar16 = pbVar16 + 2;
            local_68 = local_68 | (ulong)*pbVar1 << ((byte)lVar6 & 0x3f);
            lVar6 = local_58 + 0x10;
          }
          else {
            pbVar16 = pbVar16 + 1;
          }
          uVar5 = (uint)local_68 & 0x1ff;
          local_68 = local_68 >> 9;
          local_58 = lVar6 + -9;
          local_70 = local_70 - 9;
        }
      } while (uVar5 == 0x100);
      if (uVar5 == 0x101) {
        plVar14 = (long *)(lVar10 + 0x1ff0);
        uVar17 = 9;
        uVar19 = 0x1ff;
        goto LAB_002af06c;
      }
      if (0x100 < uVar5) {
        module = tif->tif_name;
        uVar19 = (ulong)tif->tif_row;
        fmt = "LZWDecode: Corrupted LZW table at scanline %u";
LAB_002af16d:
        TIFFErrorExtR(tif,module,fmt,uVar19);
        return 0;
      }
      plVar14 = (long *)(lVar10 + 0x1ff0);
      *puVar4 = (uint8_t)uVar5;
      uVar17 = 9;
      uVar19 = 0x1ff;
      plVar8 = (long *)((ulong)(uVar5 << 4) + *(long *)(puVar2 + 0xe8));
      lVar9 = lVar9 + -1;
      op0 = puVar4 + 1;
      goto joined_r0x002aed0a;
    }
    if (uVar5 == 0x101) goto LAB_002af06c;
    plVar3 = *(long **)(puVar2 + 0xe8);
    if ((((plVar18 < plVar3) || (plVar3 + 0x27fe <= plVar18)) ||
        (*plVar18 = (long)plVar8, plVar8 < plVar3)) || (plVar3 + 0x27fe <= plVar8)) {
      uVar19 = (ulong)tif->tif_row;
      module = "LZWDecodeCompat";
      fmt = "Corrupted LZW table at scanline %u";
      goto LAB_002af16d;
    }
    plVar7 = (long *)((ulong)(uVar5 << 4) + (long)plVar3);
    *(undefined1 *)((long)plVar18 + 10) = *(undefined1 *)((long)plVar8 + 10);
    *(short *)(plVar18 + 1) = (short)(int)plVar8[1] + 1;
    plVar8 = plVar18;
    if (plVar7 < plVar18) {
      plVar8 = plVar7;
    }
    *(undefined1 *)((long)plVar18 + 0xb) = *(undefined1 *)((long)plVar8 + 10);
    plVar18 = plVar18 + 2;
    if (plVar14 < plVar18) {
      iVar15 = (int)uVar17;
      if (10 < iVar15) {
        iVar15 = 0xb;
      }
      uVar17 = (ulong)(iVar15 + 1U);
      uVar19 = ~(-1L << ((byte)(iVar15 + 1U) & 0x3f));
      plVar14 = plVar3 + uVar19 * 2;
    }
    plVar8 = plVar7;
    if (0xff < uVar5) {
      uVar13 = (ulong)*(ushort *)(plVar7 + 1);
      if (uVar13 == 0) {
        uVar19 = (ulong)tif->tif_row;
        module = "LZWDecodeCompat";
        fmt = "Wrong length of decoded string: data probably corrupted at scanline %u";
        goto LAB_002af16d;
      }
      lVar10 = lVar9 - uVar13;
      if ((long)uVar13 <= lVar9) {
        puVar11 = puVar4 + uVar13;
        do {
          puVar11 = puVar11 + -1;
          *puVar11 = *(uint8_t *)((long)plVar7 + 0xb);
          plVar7 = (long *)*plVar7;
          lVar9 = lVar10;
          op0 = puVar4 + uVar13;
          if (plVar7 == (long *)0x0) break;
        } while (puVar4 < puVar11);
        goto joined_r0x002aed0a;
      }
      *(long **)(puVar2 + 200) = plVar7;
      do {
        plVar7 = (long *)*plVar7;
      } while (lVar9 < (long)(ulong)*(ushort *)(plVar7 + 1));
      *(long *)(puVar2 + 0xa8) = lVar9;
      lVar10 = lVar9;
      do {
        puVar4[lVar10 + -1] = *(uint8_t *)((long)plVar7 + 0xb);
        plVar7 = (long *)*plVar7;
        lVar10 = lVar10 + -1;
        lVar9 = 0;
      } while (lVar10 != 0);
LAB_002af06c:
      puVar4 = tif->tif_rawcp;
      lVar10 = tif->tif_rawcc;
      tif->tif_rawcc = (tmsize_t)(puVar4 + (lVar10 - (long)pbVar16));
      tif->tif_rawcp = pbVar16;
      *(uint8_t **)(puVar2 + 0xb8) = puVar4 + (lVar10 - (long)pbVar16);
      *(ulong *)(puVar2 + 0xb0) = local_70;
      *(short *)(puVar2 + 0x80) = (short)uVar17;
      *(ulong *)(puVar2 + 0x88) = local_68;
      *(long *)(puVar2 + 0x90) = local_58;
      *(ulong *)(puVar2 + 0xa0) = uVar19;
      *(long **)(puVar2 + 0xd0) = plVar8;
      *(long **)(puVar2 + 0xd8) = plVar18;
      *(long **)(puVar2 + 0xe0) = plVar14;
      if (0 < lVar9) {
        TIFFErrorExtR(tif,"LZWDecodeCompat","Not enough data at scanline %u (short %lu bytes)",
                      (ulong)tif->tif_row);
        return 0;
      }
      return 1;
    }
    *puVar4 = (uint8_t)uVar5;
    lVar9 = lVar9 + -1;
    op0 = puVar4 + 1;
  } while( true );
}

Assistant:

static int LZWDecodeCompat(TIFF *tif, uint8_t *op0, tmsize_t occ0, uint16_t s)
{
    static const char module[] = "LZWDecodeCompat";
    LZWCodecState *sp = DecoderState(tif);
    uint8_t *op = (uint8_t *)op0;
    tmsize_t occ = occ0;
    uint8_t *tp;
    uint8_t *bp;
    int code, nbits;
    int len;
    long nextbits, nbitsmask;
    WordType nextdata;
    code_t *codep, *free_entp, *maxcodep, *oldcodep;

    (void)s;
    assert(sp != NULL);

    /*
     * Restart interrupted output operation.
     */
    if (sp->dec_restart)
    {
        tmsize_t residue;

        codep = sp->dec_codep;
        residue = codep->length - sp->dec_restart;
        if (residue > occ)
        {
            /*
             * Residue from previous decode is sufficient
             * to satisfy decode request.  Skip to the
             * start of the decoded string, place decoded
             * values in the output buffer, and return.
             */
            sp->dec_restart += occ;
            do
            {
                codep = codep->next;
            } while (--residue > occ);
            tp = op + occ;
            do
            {
                *--tp = codep->value;
                codep = codep->next;
            } while (--occ);
            return (1);
        }
        /*
         * Residue satisfies only part of the decode request.
         */
        op += residue;
        occ -= residue;
        tp = op;
        do
        {
            *--tp = codep->value;
            codep = codep->next;
        } while (--residue);
        sp->dec_restart = 0;
    }

    bp = (uint8_t *)tif->tif_rawcp;

    sp->dec_bitsleft += (((uint64_t)tif->tif_rawcc - sp->old_tif_rawcc) << 3);
    uint64_t dec_bitsleft = sp->dec_bitsleft;

    nbits = sp->lzw_nbits;
    nextdata = sp->lzw_nextdata;
    nextbits = sp->lzw_nextbits;
    nbitsmask = sp->dec_nbitsmask;
    oldcodep = sp->dec_oldcodep;
    free_entp = sp->dec_free_entp;
    maxcodep = sp->dec_maxcodep;

    while (occ > 0)
    {
        NextCode(tif, sp, bp, code, GetNextCodeCompat, dec_bitsleft);
        if (code == CODE_EOI)
            break;
        if (code == CODE_CLEAR)
        {
            do
            {
                free_entp = sp->dec_codetab + CODE_FIRST;
                _TIFFmemset(free_entp, 0,
                            (CSIZE - CODE_FIRST) * sizeof(code_t));
                nbits = BITS_MIN;
                nbitsmask = MAXCODE(BITS_MIN);
                maxcodep = sp->dec_codetab + nbitsmask;
                NextCode(tif, sp, bp, code, GetNextCodeCompat, dec_bitsleft);
            } while (code == CODE_CLEAR); /* consecutive CODE_CLEAR codes */
            if (code == CODE_EOI)
                break;
            if (code > CODE_CLEAR)
            {
                TIFFErrorExtR(
                    tif, tif->tif_name,
                    "LZWDecode: Corrupted LZW table at scanline %" PRIu32,
                    tif->tif_row);
                return (0);
            }
            *op++ = (uint8_t)code;
            occ--;
            oldcodep = sp->dec_codetab + code;
            continue;
        }
        codep = sp->dec_codetab + code;

        /*
         * Add the new entry to the code table.
         */
        if (free_entp < &sp->dec_codetab[0] ||
            free_entp >= &sp->dec_codetab[CSIZE])
        {
            TIFFErrorExtR(tif, module,
                          "Corrupted LZW table at scanline %" PRIu32,
                          tif->tif_row);
            return (0);
        }

        free_entp->next = oldcodep;
        if (free_entp->next < &sp->dec_codetab[0] ||
            free_entp->next >= &sp->dec_codetab[CSIZE])
        {
            TIFFErrorExtR(tif, module,
                          "Corrupted LZW table at scanline %" PRIu32,
                          tif->tif_row);
            return (0);
        }
        free_entp->firstchar = free_entp->next->firstchar;
        free_entp->length = free_entp->next->length + 1;
        free_entp->value =
            (codep < free_entp) ? codep->firstchar : free_entp->firstchar;
        if (++free_entp > maxcodep)
        {
            if (++nbits > BITS_MAX) /* should not happen */
                nbits = BITS_MAX;
            nbitsmask = MAXCODE(nbits);
            maxcodep = sp->dec_codetab + nbitsmask;
        }
        oldcodep = codep;
        if (code >= 256)
        {
            /*
             * Code maps to a string, copy string
             * value to output (written in reverse).
             */
            if (codep->length == 0)
            {
                TIFFErrorExtR(
                    tif, module,
                    "Wrong length of decoded "
                    "string: data probably corrupted at scanline %" PRIu32,
                    tif->tif_row);
                return (0);
            }
            if (codep->length > occ)
            {
                /*
                 * String is too long for decode buffer,
                 * locate portion that will fit, copy to
                 * the decode buffer, and setup restart
                 * logic for the next decoding call.
                 */
                sp->dec_codep = codep;
                do
                {
                    codep = codep->next;
                } while (codep->length > occ);
                sp->dec_restart = occ;
                tp = op + occ;
                do
                {
                    *--tp = codep->value;
                    codep = codep->next;
                } while (--occ);
                break;
            }
            len = codep->length;
            tp = op + len;
            do
            {
                *--tp = codep->value;
                codep = codep->next;
            } while (codep && tp > op);
            assert(occ >= len);
            op += len;
            occ -= len;
        }
        else
        {
            *op++ = (uint8_t)code;
            occ--;
        }
    }

    tif->tif_rawcc -= (tmsize_t)((uint8_t *)bp - tif->tif_rawcp);
    tif->tif_rawcp = (uint8_t *)bp;

    sp->old_tif_rawcc = tif->tif_rawcc;
    sp->dec_bitsleft = dec_bitsleft;

    sp->lzw_nbits = (unsigned short)nbits;
    sp->lzw_nextdata = nextdata;
    sp->lzw_nextbits = nextbits;
    sp->dec_nbitsmask = nbitsmask;
    sp->dec_oldcodep = oldcodep;
    sp->dec_free_entp = free_entp;
    sp->dec_maxcodep = maxcodep;

    if (occ > 0)
    {
        TIFFErrorExtR(tif, module,
                      "Not enough data at scanline %" PRIu32 " (short %" PRIu64
                      " bytes)",
                      tif->tif_row, (uint64_t)occ);
        return (0);
    }
    return (1);
}